

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::
streamDefinition(LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier> *this,
                ostringstream *str,GLenum shader)

{
  NumSys NVar1;
  _func_int *p_Var2;
  uint uVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  
  if ((this->super_LayoutSpecifierBase).val < 0) {
    return;
  }
  bVar4 = DefOccurence::occurs(&(this->super_LayoutSpecifierBase).occurence,shader);
  if (!bVar4) {
    return;
  }
  std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,"layout(location = ");
  NVar1 = (this->super_LayoutSpecifierBase).numSys;
  if (NVar1 == Oct) {
    pcVar6 = "0";
    uVar3 = 0x40;
  }
  else {
    if (NVar1 != Hex) goto LAB_00bdf03c;
    pcVar6 = "0x";
    uVar3 = 8;
  }
  p_Var2 = (str->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3];
  *(uint *)(&(str->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 + (long)p_Var2) =
       *(uint *)(&(str->super_basic_ostream<char,_std::char_traits<char>_>).field_0x18 +
                (long)p_Var2) & 0xffffffb5 | uVar3;
  std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6);
LAB_00bdf03c:
  poVar5 = (ostream *)std::ostream::operator<<(str,(this->super_LayoutSpecifierBase).val);
  *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
  std::operator<<(poVar5,") ");
  return;
}

Assistant:

void LayoutSpecifier<LocationSpecifier>::streamDefinition(std::ostringstream& str, GLenum shader) const
{
	if (val < 0 || !occurence.occurs(shader))
	{
		return;
	}

	str << "layout(location = ";
	if (numSys == Loc::Oct)
	{
		str << std::oct << "0";
	}
	else if (numSys == Loc::Hex)
	{
		str << std::hex << "0x";
	}
	str << val << std::dec << ") ";
}